

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::MultiNode<QString,_RCCFileInfo_*>::MultiNode
          (MultiNode<QString,_RCCFileInfo_*> *this,MultiNode<QString,_RCCFileInfo_*> *other)

{
  Data *pDVar1;
  Chain *pCVar2;
  MultiNodeChain<RCCFileInfo_*> **ppMVar3;
  Chain *pCVar4;
  
  pDVar1 = (other->key).d.d;
  (this->key).d.d = pDVar1;
  (this->key).d.ptr = (other->key).d.ptr;
  (this->key).d.size = (other->key).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pCVar4 = other->value;
  if (pCVar4 != (Chain *)0x0) {
    ppMVar3 = &this->value;
    do {
      pCVar2 = (Chain *)operator_new(0x10);
      pCVar2->value = pCVar4->value;
      pCVar2->next = (MultiNodeChain<RCCFileInfo_*> *)0x0;
      *ppMVar3 = pCVar2;
      ppMVar3 = &pCVar2->next;
      pCVar4 = pCVar4->next;
    } while (pCVar4 != (MultiNodeChain<RCCFileInfo_*> *)0x0);
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }